

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertToLHProcess.cpp
# Opt level: O1

void __thiscall
Assimp::FlipWindingOrderProcess::ProcessMesh(FlipWindingOrderProcess *this,aiMesh *pMesh)

{
  undefined8 *puVar1;
  float fVar2;
  uint *puVar3;
  aiAnimMesh *paVar4;
  aiVector3D *paVar5;
  undefined8 uVar6;
  aiColor4D *paVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ulong uVar10;
  aiFace *paVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  
  if (pMesh->mNumFaces != 0) {
    uVar10 = 0;
    do {
      uVar12 = pMesh->mFaces[uVar10].mNumIndices;
      if (1 < uVar12) {
        paVar11 = pMesh->mFaces + uVar10;
        iVar13 = -1;
        uVar15 = 0;
        do {
          puVar3 = paVar11->mIndices;
          uVar14 = puVar3[uVar15];
          puVar3[uVar15] = puVar3[uVar12 + iVar13];
          puVar3[uVar12 + iVar13] = uVar14;
          uVar15 = uVar15 + 1;
          uVar12 = paVar11->mNumIndices;
          iVar13 = iVar13 + -1;
        } while (uVar15 < uVar12 >> 1);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < pMesh->mNumFaces);
  }
  if (pMesh->mNumAnimMeshes != 0) {
    uVar10 = 0;
    do {
      paVar4 = pMesh->mAnimMeshes[uVar10];
      uVar12 = paVar4->mNumVertices;
      uVar15 = (ulong)uVar12;
      if (uVar12 != 0 && paVar4->mVertices != (aiVector3D *)0x0) {
        lVar16 = 0;
        uVar14 = uVar12;
        do {
          uVar14 = uVar14 - 1;
          paVar5 = paVar4->mVertices;
          fVar2 = *(float *)((long)&paVar5->z + lVar16);
          uVar6 = *(undefined8 *)((long)&paVar5->x + lVar16);
          *(float *)((long)&paVar5->z + lVar16) = paVar5[uVar14].z;
          *(undefined8 *)((long)&paVar5->x + lVar16) = *(undefined8 *)(paVar5 + uVar14);
          paVar5[uVar14].z = fVar2;
          paVar5[uVar14].x = (float)(int)uVar6;
          paVar5[uVar14].y = (float)(int)((ulong)uVar6 >> 0x20);
          lVar16 = lVar16 + 0xc;
        } while (uVar15 * 0xc != lVar16);
      }
      if (uVar12 != 0 && paVar4->mNormals != (aiVector3D *)0x0) {
        lVar16 = 0;
        uVar14 = uVar12;
        do {
          uVar14 = uVar14 - 1;
          paVar5 = paVar4->mNormals;
          fVar2 = *(float *)((long)&paVar5->z + lVar16);
          uVar6 = *(undefined8 *)((long)&paVar5->x + lVar16);
          *(float *)((long)&paVar5->z + lVar16) = paVar5[uVar14].z;
          *(undefined8 *)((long)&paVar5->x + lVar16) = *(undefined8 *)(paVar5 + uVar14);
          paVar5[uVar14].z = fVar2;
          paVar5[uVar14].x = (float)(int)uVar6;
          paVar5[uVar14].y = (float)(int)((ulong)uVar6 >> 0x20);
          lVar16 = lVar16 + 0xc;
        } while (uVar15 * 0xc != lVar16);
      }
      uVar14 = uVar12 - 1;
      lVar16 = 0;
      do {
        if (paVar4->mTextureCoords[lVar16] != (aiVector3D *)0x0 && uVar12 != 0) {
          lVar18 = 0;
          uVar17 = uVar14;
          do {
            paVar5 = paVar4->mTextureCoords[lVar16];
            fVar2 = *(float *)((long)&paVar5->z + lVar18);
            uVar6 = *(undefined8 *)((long)&paVar5->x + lVar18);
            *(float *)((long)&paVar5->z + lVar18) = paVar5[uVar17].z;
            *(undefined8 *)((long)&paVar5->x + lVar18) = *(undefined8 *)(paVar5 + uVar17);
            paVar5[uVar17].z = fVar2;
            paVar5[uVar17].x = (float)(int)uVar6;
            paVar5[uVar17].y = (float)(int)((ulong)uVar6 >> 0x20);
            lVar18 = lVar18 + 0xc;
            uVar17 = uVar17 - 1;
          } while (uVar15 * 0xc != lVar18);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != 8);
      if (uVar12 != 0 && paVar4->mTangents != (aiVector3D *)0x0) {
        lVar16 = 0;
        uVar17 = uVar14;
        do {
          paVar5 = paVar4->mTangents;
          fVar2 = *(float *)((long)&paVar5->z + lVar16);
          uVar6 = *(undefined8 *)((long)&paVar5->x + lVar16);
          *(float *)((long)&paVar5->z + lVar16) = paVar5[uVar17].z;
          *(undefined8 *)((long)&paVar5->x + lVar16) = *(undefined8 *)(paVar5 + uVar17);
          paVar5[uVar17].z = fVar2;
          paVar5[uVar17].x = (float)(int)uVar6;
          paVar5[uVar17].y = (float)(int)((ulong)uVar6 >> 0x20);
          paVar5 = paVar4->mBitangents;
          fVar2 = *(float *)((long)&paVar5->z + lVar16);
          uVar6 = *(undefined8 *)((long)&paVar5->x + lVar16);
          *(float *)((long)&paVar5->z + lVar16) = paVar5[uVar17].z;
          *(undefined8 *)((long)&paVar5->x + lVar16) = *(undefined8 *)(paVar5 + uVar17);
          paVar5[uVar17].z = fVar2;
          paVar5[uVar17].x = (float)(int)uVar6;
          paVar5[uVar17].y = (float)(int)((ulong)uVar6 >> 0x20);
          lVar16 = lVar16 + 0xc;
          uVar17 = uVar17 - 1;
        } while (uVar15 * 0xc != lVar16);
      }
      lVar16 = 0;
      do {
        if (paVar4->mColors[lVar16] != (aiColor4D *)0x0 && uVar12 != 0) {
          lVar18 = 0;
          uVar17 = uVar14;
          do {
            paVar7 = paVar4->mColors[lVar16];
            puVar1 = (undefined8 *)((long)&paVar7->r + lVar18);
            uVar6 = *puVar1;
            uVar8 = puVar1[1];
            uVar9 = *(undefined8 *)&paVar7[uVar17].b;
            puVar1 = (undefined8 *)((long)&paVar7->r + lVar18);
            *puVar1 = *(undefined8 *)(paVar7 + uVar17);
            puVar1[1] = uVar9;
            paVar7 = paVar7 + uVar17;
            paVar7->r = (float)(int)uVar6;
            paVar7->g = (float)(int)((ulong)uVar6 >> 0x20);
            paVar7->b = (float)(int)uVar8;
            paVar7->a = (float)(int)((ulong)uVar8 >> 0x20);
            lVar18 = lVar18 + 0x10;
            uVar17 = uVar17 - 1;
          } while (uVar15 << 4 != lVar18);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != 8);
      uVar10 = uVar10 + 1;
    } while (uVar10 < pMesh->mNumAnimMeshes);
  }
  return;
}

Assistant:

void FlipWindingOrderProcess::ProcessMesh( aiMesh* pMesh)
{
    // invert the order of all faces in this mesh
    for( unsigned int a = 0; a < pMesh->mNumFaces; a++)
    {
        aiFace& face = pMesh->mFaces[a];
        for (unsigned int b = 0; b < face.mNumIndices / 2; b++) {
            std::swap(face.mIndices[b], face.mIndices[face.mNumIndices - 1 - b]);
        }
    }

    // invert the order of all components in this mesh anim meshes
    for (unsigned int m = 0; m < pMesh->mNumAnimMeshes; m++) {
        aiAnimMesh* animMesh = pMesh->mAnimMeshes[m];
        unsigned int numVertices = animMesh->mNumVertices;
        if (animMesh->HasPositions()) {
            for (unsigned int a = 0; a < numVertices; a++)
            {
                std::swap(animMesh->mVertices[a], animMesh->mVertices[numVertices - 1 - a]);
            }
        }
        if (animMesh->HasNormals()) {
            for (unsigned int a = 0; a < numVertices; a++)
            {
                std::swap(animMesh->mNormals[a], animMesh->mNormals[numVertices - 1 - a]);
            }
        }
        for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; i++) {
            if (animMesh->HasTextureCoords(i)) {
                for (unsigned int a = 0; a < numVertices; a++)
                {
                    std::swap(animMesh->mTextureCoords[i][a], animMesh->mTextureCoords[i][numVertices - 1 - a]);
                }
            }
        }
        if (animMesh->HasTangentsAndBitangents()) {
            for (unsigned int a = 0; a < numVertices; a++)
            {
                std::swap(animMesh->mTangents[a], animMesh->mTangents[numVertices - 1 - a]);
                std::swap(animMesh->mBitangents[a], animMesh->mBitangents[numVertices - 1 - a]);
            }
        }
        for (unsigned int v = 0; v < AI_MAX_NUMBER_OF_COLOR_SETS; v++) {
            if (animMesh->HasVertexColors(v)) {
                for (unsigned int a = 0; a < numVertices; a++)
                {
                    std::swap(animMesh->mColors[v][a], animMesh->mColors[v][numVertices - 1 - a]);
                }
            }
        }
    }
}